

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::Print
          (Printer *this,Message *message,BaseTextGenerator *generator)

{
  MessagePrinter *pMVar1;
  bool bVar2;
  int iVar3;
  pointer prVar4;
  Metadata MVar5;
  Descriptor *descriptor;
  const_iterator itr;
  ArrayInputStream input;
  anon_union_16_2_b9f6da03_for_SooRep_0 local_68;
  string local_58;
  ArrayInputStream local_38;
  
  MVar5 = Message::GetMetadata(message);
  if (MVar5.reflection == (Reflection *)0x0) {
    local_68.long_rep.elements_int = 0;
    local_68.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
    MessageLite::SerializeAsString_abi_cxx11_(&local_58,&message->super_MessageLite);
    io::ArrayInputStream::ArrayInputStream
              (&local_38,local_58._M_dataplus._M_p,(undefined4)local_58._M_string_length,-1);
    UnknownFieldSet::ParseFromZeroCopyStream
              ((UnknownFieldSet *)&local_68.long_rep,&local_38.super_ZeroCopyInputStream);
    if ((iterator *)local_58._M_dataplus._M_p != (iterator *)&local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    PrintUnknownFields(this,(UnknownFieldSet *)&local_68.long_rep,generator,10);
    iVar3 = internal::SooRep::size
                      ((SooRep *)&local_68.long_rep,(local_68.long_rep.elements_int & 4) == 0);
    if (iVar3 != 0) {
      UnknownFieldSet::ClearFallback((UnknownFieldSet *)&local_68.long_rep);
    }
    RepeatedField<google::protobuf::UnknownField>::~RepeatedField
              ((RepeatedField<google::protobuf::UnknownField> *)&local_68.long_rep);
  }
  else {
    MVar5 = Message::GetMetadata(message);
    local_68.long_rep.elements_int = (uintptr_t)MVar5.descriptor;
    local_58._0_16_ =
         absl::lts_20240722::container_internal::
         raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>>>
         ::find<google::protobuf::Descriptor_const*>
                   ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>>>
                     *)&this->custom_message_printers_,
                    (key_arg<const_google::protobuf::Descriptor_*> *)&local_68);
    local_38.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream = (_func_int **)0x0;
    bVar2 = absl::lts_20240722::container_internal::operator==
                      ((iterator *)&local_58,(iterator *)&local_38);
    if (bVar2) {
      PrintMessage(this,message,generator);
    }
    else {
      prVar4 = absl::lts_20240722::container_internal::
               raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
               ::iterator::operator->((iterator *)&local_58);
      pMVar1 = (prVar4->second)._M_t.
               super___uniq_ptr_impl<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::MessagePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>
               .super__Head_base<0UL,_const_google::protobuf::TextFormat::MessagePrinter_*,_false>.
               _M_head_impl;
      (**(code **)(*(long *)pMVar1 + 0x10))(pMVar1,message,this->single_line_mode_,generator);
    }
  }
  return;
}

Assistant:

void TextFormat::Printer::Print(const Message& message,
                                BaseTextGenerator* generator) const {
  const Reflection* reflection = message.GetReflection();
  if (!reflection) {
    // This message does not provide any way to describe its structure.
    // Parse it again in an UnknownFieldSet, and display this instead.
    UnknownFieldSet unknown_fields;
    {
      std::string serialized = message.SerializeAsString();
      io::ArrayInputStream input(serialized.data(), serialized.size());
      unknown_fields.ParseFromZeroCopyStream(&input);
    }
    PrintUnknownFields(unknown_fields, generator, kUnknownFieldRecursionLimit);
    return;
  }
  const Descriptor* descriptor = message.GetDescriptor();
  auto itr = custom_message_printers_.find(descriptor);
  if (itr != custom_message_printers_.end()) {
    itr->second->Print(message, single_line_mode_, generator);
    return;
  }
  PrintMessage(message, generator);
}